

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O1

void ImGuiStb::stb_textedit_delete
               (ImGuiTextEditState *str,STB_TexteditState *state,int where,int len)

{
  ImWchar *pIVar1;
  int iVar2;
  ulong uVar3;
  
  pIVar1 = stb_text_createundo(&state->undostate,where,len,0);
  if (0 < len && pIVar1 != (ImWchar *)0x0) {
    iVar2 = (str->Text).Size;
    if (iVar2 <= where) {
      iVar2 = where;
    }
    uVar3 = 0;
    do {
      if ((uint)(iVar2 - where) == uVar3) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c1,
                      "const value_type &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                     );
      }
      pIVar1[uVar3] = (str->Text).Data[(long)where + uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)len != uVar3);
  }
  STB_TEXTEDIT_DELETECHARS(str,where,len);
  state->has_preferred_x = '\0';
  return;
}

Assistant:

static void stb_textedit_delete(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int len)
{
   stb_text_makeundo_delete(str, state, where, len);
   STB_TEXTEDIT_DELETECHARS(str, where, len);
   state->has_preferred_x = 0;
}